

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string_t __thiscall
duckdb::Base64EncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (Base64EncodeOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  char *pcVar3;
  string_t sVar4;
  string_t sVar5;
  undefined1 auVar6 [16];
  string_t result_str;
  uint local_28;
  undefined4 uStack_24;
  char *local_20;
  
  sVar4.value._8_8_ = input.value._0_8_;
  sVar4.value._0_8_ = this;
  uVar2 = duckdb::Blob::ToBase64Size(sVar4);
  auVar6 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  local_20 = auVar6._8_8_;
  local_28 = auVar6._0_4_;
  uStack_24 = auVar6._4_4_;
  pcVar3 = local_20;
  if (local_28 < 0xd) {
    pcVar3 = (char *)&uStack_24;
  }
  sVar5.value.pointer.ptr = (char *)sVar4.value._8_8_;
  sVar5.value._0_8_ = this;
  duckdb::Blob::ToBase64(sVar5,pcVar3);
  uVar2 = auVar6._0_8_ & 0xffffffff;
  if (uVar2 < 0xd) {
    memset((char *)((long)&uStack_24 + uVar2),0,0xc - uVar2);
  }
  else {
    uStack_24 = *(undefined4 *)local_20;
  }
  aVar1._4_1_ = (undefined1)uStack_24;
  aVar1._5_1_ = uStack_24._1_1_;
  aVar1._6_1_ = uStack_24._2_1_;
  aVar1._7_1_ = uStack_24._3_1_;
  aVar1.pointer.length = local_28;
  aVar1.pointer.ptr = local_20;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_str = StringVector::EmptyString(result, Blob::ToBase64Size(input));
		Blob::ToBase64(input, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}